

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_util_traceexitstub(lua_State *L)

{
  uint uVar1;
  long in_RDI;
  jit_State *J;
  ExitNo exitno;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint local_24;
  
  uVar1 = lj_lib_checkint((lua_State *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                          ,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  if (uVar1 < 0x200) {
    *(double *)(*(long *)(in_RDI + 0x18) + -8) =
         (double)(long)(*(long *)((ulong)*(uint *)(in_RDI + 8) + 0x8c8 + (ulong)(uVar1 >> 5) * 8) +
                       (ulong)((uVar1 & 0x1f) << 2));
  }
  local_24 = (uint)(uVar1 < 0x200);
  return local_24;
}

Assistant:

LJLIB_CF(jit_util_traceexitstub)
{
#ifdef EXITSTUBS_PER_GROUP
  ExitNo exitno = (ExitNo)lj_lib_checkint(L, 1);
  jit_State *J = L2J(L);
  if (exitno < EXITSTUBS_PER_GROUP*LJ_MAX_EXITSTUBGR) {
    setintptrV(L->top-1, (intptr_t)(void *)exitstub_addr(J, exitno));
    return 1;
  }
#else
  if (L->top > L->base+1) {  /* Don't throw for one-argument variant. */
    GCtrace *T = jit_checktrace(L);
    ExitNo exitno = (ExitNo)lj_lib_checkint(L, 2);
    ExitNo maxexit = T->root ? T->nsnap+1 : T->nsnap;
    if (T && T->mcode != NULL && exitno < maxexit) {
      setintptrV(L->top-1, (intptr_t)(void *)exitstub_trace_addr(T, exitno));
      return 1;
    }
  }
#endif
  return 0;
}